

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_funcs.c
# Opt level: O0

PFN_vkVoidFunction ktxLoadVulkanFunction(char *pName)

{
  ktx_error_code_e kVar1;
  undefined8 in_RDI;
  PFN_vkVoidFunction pfn;
  ktx_error_code_e rc;
  PFN_vkVoidFunction local_8;
  
  kVar1 = ktxLoadVulkanLibrary();
  if (kVar1 == KTX_SUCCESS) {
    local_8 = (PFN_vkVoidFunction)dlsym(ktxVulkanModuleHandle,in_RDI);
    if (local_8 == (PFN_vkVoidFunction)0x0) {
      fprintf(_stderr,"Couldn\'t load Vulkan command: %s\n",in_RDI);
      local_8 = (PFN_vkVoidFunction)0x0;
    }
  }
  else {
    local_8 = (PFN_vkVoidFunction)0x0;
  }
  return local_8;
}

Assistant:

PFN_vkVoidFunction
ktxLoadVulkanFunction(const char* pName) {
    ktx_error_code_e rc = ktxLoadVulkanLibrary();
    if (rc != KTX_SUCCESS) {
        return NULL;
    }

    PFN_vkVoidFunction pfn
           = (PFN_vkVoidFunction)LoadProcAddr(ktxVulkanModuleHandle, pName);
    if (pfn == NULL) {
        fprintf(stderr, "Couldn't load Vulkan command: %s\n", pName);
        return NULL;
    }
    return pfn;
}